

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat2wasm.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  ValidateOptions *options;
  string *psVar1;
  WastParseOptions *options_00;
  pointer pcVar2;
  OutputBuffer *this;
  pointer start;
  pointer puVar3;
  code *pcVar4;
  undefined8 *puVar5;
  _Head_base<0UL,_wabt::LexerSource_*,_false> line_finder;
  Module *this_00;
  _Alloc_hider _Var6;
  Result RVar7;
  char *pcVar8;
  void *pvVar9;
  size_t sVar10;
  Callback *callback;
  size_t *unaff_RBX;
  uint uVar11;
  ulong unaff_RBP;
  char *pcVar12;
  undefined8 unaff_R12;
  pointer unaff_R13;
  char *unaff_R14;
  pointer unaff_R15;
  string_view filename;
  string_view filename_00;
  string_view sVar13;
  string result;
  Errors errors;
  OptionParser parser;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  WastParseOptions parse_wast_options;
  
  pcVar12 = (char *)(ulong)(uint)argc;
  while( true ) {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(pointer *)((long)register0x00000020 + -0x10) = unaff_R15;
    *(char **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(pointer *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(undefined8 *)((long)register0x00000020 + -0x28) = unaff_R12;
    *(size_t **)((long)register0x00000020 + -0x30) = unaff_RBX;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151a47;
    wabt::InitStdio();
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151a62;
    wabt::OptionParser::OptionParser
              ((OptionParser *)((long)register0x00000020 + -0x108),"wat2wasm",
               "  read a file in the wasm text format, check it for errors, and\n  convert it to the wasm binary format.\n\nexamples:\n  # parse and typecheck test.wat\n  $ wat2wasm test.wat\n\n  # parse test.wat and write to binary file test.wasm\n  $ wat2wasm test.wat -o test.wasm\n\n  # parse spec-test.wast, and write verbose output to stdout (including\n  # the meaning of every byte)\n  $ wat2wasm spec-test.wast -v\n"
              );
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:70:72)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:70:72)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151aa2;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),'v',"verbose",
               "Use multiple times for more info",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151aba;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:75:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:75:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151af7;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),"debug-parser",
               "Turn on debugging the parser of wat files",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151b0f;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:78:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:78:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151b51;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),'d',"dump-module",
               "Print a hexdump of the module to stdout",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151b69;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151b7d;
    wabt::Features::AddOptions(&s_features,(OptionParser *)((long)register0x00000020 + -0x108));
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:81:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:81:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151bc4;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),'o',"output","FILE",
               "output wasm binary file",(Callback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151bdc;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:85:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:85:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151c1e;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),'r',"relocatable",
               "Create a relocatable wasm binary (suitable for linking with e.g. lld)",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151c36;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:89:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:89:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151c73;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),"no-canonicalize-leb128s",
               "Write all LEB128 sizes as 5-bytes instead of their minimal size",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151c8b;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:92:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:92:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151cc8;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),"debug-names",
               "Write debug names to the generated binary file",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151ce0;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x158))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x150) = 0;
    *(code **)((long)register0x00000020 + -0x140) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:94:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x148) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:94:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151d1d;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x108),"no-check",
               "Don\'t check for invalid modules",
               (NullCallback *)((long)register0x00000020 + -0x158));
    if (*(code **)((long)register0x00000020 + -0x148) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151d35;
      (**(code **)((long)register0x00000020 + -0x148))
                ((undefined1 *)((long)register0x00000020 + -0x158),
                 (undefined1 *)((long)register0x00000020 + -0x158),3);
    }
    unaff_R15 = (pointer)((long)register0x00000020 + -0x148);
    *(pointer *)((long)register0x00000020 + -0x158) = unaff_R15;
    unaff_R15[0] = 'f';
    unaff_R15[1] = 'i';
    unaff_R15[2] = 'l';
    unaff_R15[3] = 'e';
    unaff_R15[4] = 'n';
    unaff_R15[5] = 'a';
    unaff_R15[6] = 'm';
    unaff_R15[7] = 'e';
    *(undefined8 *)((long)register0x00000020 + -0x150) = 8;
    *(undefined1 *)((long)register0x00000020 + -0x140) = 0;
    callback = (Callback *)((long)register0x00000020 + -0x78);
    *(undefined8 *)&(callback->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x70) = 0;
    *(code **)((long)register0x00000020 + -0x60) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:96:22)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x68) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wat2wasm.cc:96:22)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151d91;
    wabt::OptionParser::AddArgument
              ((OptionParser *)((long)register0x00000020 + -0x108),
               (string *)((long)register0x00000020 + -0x158),One,callback);
    if (*(code **)((long)register0x00000020 + -0x68) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151dac;
      (**(code **)((long)register0x00000020 + -0x68))
                ((undefined1 *)((long)register0x00000020 + -0x78),
                 (undefined1 *)((long)register0x00000020 + -0x78),3);
    }
    if (*(pointer *)((long)register0x00000020 + -0x158) != unaff_R15) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151dbb;
      operator_delete(*(pointer *)((long)register0x00000020 + -0x158));
    }
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151dcd;
    wabt::OptionParser::Parse((OptionParser *)((long)register0x00000020 + -0x108),(int)pcVar12,argv)
    ;
    if (*(code **)((long)register0x00000020 + -0x88) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151deb;
      (**(code **)((long)register0x00000020 + -0x88))
                ((undefined1 *)((long)register0x00000020 + -0x98),
                 (undefined1 *)((long)register0x00000020 + -0x98),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151df8;
    std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::
    ~vector((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
            ((long)register0x00000020 + -0xb0));
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e08;
    std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
              ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
               ((long)register0x00000020 + -200));
    if (*(undefined1 **)((long)register0x00000020 + -0xe8) !=
        (undefined1 *)((long)register0x00000020 + -0xd8)) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e1e;
      operator_delete(*(undefined1 **)((long)register0x00000020 + -0xe8));
    }
    unaff_R13 = (pointer)((long)register0x00000020 + -0xf8);
    if (*(pointer *)((long)register0x00000020 + -0x108) != unaff_R13) {
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e31;
      operator_delete(*(pointer *)((long)register0x00000020 + -0x108));
    }
    pcVar12 = s_infile;
    unaff_RBX = (size_t *)((long)register0x00000020 + -0x78);
    *unaff_RBX = 0;
    *(undefined8 *)((long)register0x00000020 + -0x70) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x68) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e56;
    pcVar8 = (char *)strlen(s_infile);
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e64;
    sVar13.size_ = (size_type)unaff_RBX;
    sVar13.data_ = pcVar8;
    RVar7 = wabt::ReadFile((wabt *)pcVar12,sVar13,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
    unaff_R14 = s_infile;
    unaff_RBP = (ulong)RVar7.enum_;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e75;
    pvVar9 = (void *)strlen(s_infile);
    pcVar12 = (char *)((long)register0x00000020 + -0x138);
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151e8f;
    filename_00.size_ = (size_type)unaff_R14;
    filename_00.data_ = pcVar12;
    argv = (char **)unaff_R14;
    wabt::WastLexer::CreateBufferLexer(filename_00,pvVar9,*unaff_RBX);
    if (RVar7.enum_ != Error) break;
    *(code **)((long)register0x00000020 + -0x170) = main;
    ProgramMain();
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x168);
  }
  (((Errors *)((long)register0x00000020 + -0x128))->
  super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(undefined8 *)((long)register0x00000020 + -0x120) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x118) = 0;
  (((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
   ((long)register0x00000020 + -0x130))->_M_t).
  super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl = (Module *)0x0;
  options_00 = (WastParseOptions *)((long)register0x00000020 + -0x50);
  *(ulong *)((long)register0x00000020 + -0x4b) = CONCAT53(s_features._8_5_,s_features._5_3_);
  (options_00->features).exceptions_enabled_ = (bool)s_features.exceptions_enabled_;
  (options_00->features).mutable_globals_enabled_ = (bool)s_features.mutable_globals_enabled_;
  (options_00->features).sat_float_to_int_enabled_ = (bool)s_features.sat_float_to_int_enabled_;
  (options_00->features).sign_extension_enabled_ = (bool)s_features.sign_extension_enabled_;
  (options_00->features).simd_enabled_ = (bool)s_features.simd_enabled_;
  (options_00->features).threads_enabled_ = (bool)s_features.threads_enabled_;
  (options_00->features).multi_value_enabled_ = (bool)s_features.multi_value_enabled_;
  (options_00->features).tail_call_enabled_ = (bool)s_features.tail_call_enabled_;
  *(undefined1 *)((long)register0x00000020 + -0x43) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151edc;
  RVar7 = wabt::ParseWatModule
                    (*(WastLexer **)((long)register0x00000020 + -0x138),
                     (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                     ((long)register0x00000020 + -0x130),
                     (Errors *)((long)register0x00000020 + -0x128),options_00);
  uVar11 = 1;
  if (RVar7.enum_ == Ok) {
    if (s_validate == '\0') {
      options = (ValidateOptions *)((long)register0x00000020 + -0x108);
      *(ulong *)((long)register0x00000020 + -0x103) = CONCAT53(s_features._8_5_,s_features._5_3_);
      (options->features).exceptions_enabled_ = (bool)s_features.exceptions_enabled_;
      (options->features).mutable_globals_enabled_ = (bool)s_features.mutable_globals_enabled_;
      (options->features).sat_float_to_int_enabled_ = (bool)s_features.sat_float_to_int_enabled_;
      (options->features).sign_extension_enabled_ = (bool)s_features.sign_extension_enabled_;
      (options->features).simd_enabled_ = (bool)s_features.simd_enabled_;
      (options->features).threads_enabled_ = (bool)s_features.threads_enabled_;
      (options->features).multi_value_enabled_ = (bool)s_features.multi_value_enabled_;
      (options->features).tail_call_enabled_ = (bool)s_features.tail_call_enabled_;
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151f1b;
      RVar7 = wabt::ValidateModule
                        (*(Module **)((long)register0x00000020 + -0x130),
                         (Errors *)((long)register0x00000020 + -0x128),options);
      if (RVar7.enum_ != Ok) goto LAB_001520b6;
    }
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151f37;
    wabt::MemoryStream::MemoryStream
              ((MemoryStream *)((long)register0x00000020 + -0x108),
               (Stream *)
               s_log_stream._M_t.
               super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
               super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
               super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151f67;
    RVar7 = wabt::WriteBinaryModule
                      ((Stream *)((long)register0x00000020 + -0x108),
                       *(Module **)((long)register0x00000020 + -0x130),&s_write_binary_options);
    if (RVar7.enum_ == Ok) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151f8a;
        strlen(s_infile);
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151f95;
        wabt::GetBasename(*(string_view *)((long)register0x00000020 + -0x168));
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151fa0;
        sVar13 = wabt::StripExtension(*(string_view *)((long)register0x00000020 + -0x170));
        *(string_view *)((long)register0x00000020 + -0x40) = sVar13;
        psVar1 = (string *)((long)register0x00000020 + -0x158);
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151fbc;
        wabt::string_view::operator_cast_to_string
                  (psVar1,(string_view *)((long)register0x00000020 + -0x40));
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151fce;
        std::__cxx11::string::append((char *)psVar1);
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151fdd;
        std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)psVar1);
        pcVar2 = (psVar1->_M_dataplus)._M_p;
        if (pcVar2 != unaff_R15) {
          *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151fea;
          operator_delete(pcVar2);
        }
      }
      _Var6._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x151ff9;
      sVar10 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
      this = *(OutputBuffer **)((long)register0x00000020 + -0xe8);
      if (s_dump_module == '\x01') {
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x152017;
        wabt::FileStream::CreateStdout();
        if (s_verbose != 0) {
          *(undefined8 *)((long)register0x00000020 + -0x170) = 0x152033;
          wabt::Stream::Writef(*(Stream **)((long)register0x00000020 + -0x158),";; dump\n");
        }
        start = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (start != puVar3) {
          *(undefined8 *)((long)register0x00000020 + -0x168) = 0;
          *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15205e;
          wabt::Stream::WriteMemoryDump
                    (*(Stream **)((long)register0x00000020 + -0x158),start,
                     (long)puVar3 - (long)start,0,No,(char *)0x0,
                     *(char **)((long)register0x00000020 + -0x168));
        }
        if (*(long **)((long)register0x00000020 + -0x158) != (long *)0x0) {
          pcVar4 = *(code **)(**(long **)((long)register0x00000020 + -0x158) + 8);
          *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15206e;
          (*pcVar4)();
        }
      }
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15207c;
      filename.size_ = sVar10;
      filename.data_ = _Var6._M_p;
      wabt::OutputBuffer::WriteToFile(this,filename);
    }
    *(undefined ***)((long)register0x00000020 + -0x108) = &PTR__MemoryStream_001be6e8;
    puVar5 = *(undefined8 **)((long)register0x00000020 + -0xe8);
    if (puVar5 != (undefined8 *)0x0) {
      pvVar9 = (void *)*puVar5;
      if (pvVar9 != (void *)0x0) {
        *(undefined8 *)((long)register0x00000020 + -0x170) = 0x1520a6;
        operator_delete(pvVar9);
      }
      *(undefined8 *)((long)register0x00000020 + -0x170) = 0x1520ae;
      operator_delete(puVar5);
    }
    uVar11 = (uint)(RVar7.enum_ != Ok);
  }
LAB_001520b6:
  *(undefined8 *)((long)register0x00000020 + -0x170) = 0x1520c8;
  wabt::WastLexer::MakeLineFinder((WastLexer *)((long)register0x00000020 + -0x158));
  line_finder._M_head_impl =
       (((WastLexer *)((long)register0x00000020 + -0x158))->source_)._M_t.
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  psVar1 = (string *)((long)register0x00000020 + -0x108);
  (psVar1->_M_dataplus)._M_p = unaff_R13;
  *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
  *(undefined1 *)((long)register0x00000020 + -0xf8) = 0;
  *(undefined4 *)((long)register0x00000020 + -0x168) = 0x50;
  *(undefined8 *)((long)register0x00000020 + -0x170) = 0x152102;
  wabt::FormatErrorsToFile
            ((Errors *)((long)register0x00000020 + -0x128),Text,
             (LexerSourceLineFinder *)line_finder._M_head_impl,_stderr,psVar1,Never,
             *(int *)((long)register0x00000020 + -0x168));
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  if (pcVar2 != unaff_R13) {
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15210f;
    operator_delete(pcVar2);
  }
  if (*(LexerSourceLineFinder **)((long)register0x00000020 + -0x158) != (LexerSourceLineFinder *)0x0
     ) {
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x152123;
    std::default_delete<wabt::LexerSourceLineFinder>::operator()
              ((default_delete<wabt::LexerSourceLineFinder> *)((long)register0x00000020 + -0x158),
               *(LexerSourceLineFinder **)((long)register0x00000020 + -0x158));
  }
  this_00 = *(Module **)((long)register0x00000020 + -0x130);
  if (this_00 != (Module *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x152135;
    wabt::Module::~Module(this_00);
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15213d;
    operator_delete(this_00);
  }
  *(undefined8 *)((long)register0x00000020 + -0x170) = 0x152147;
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
             ((long)register0x00000020 + -0x128));
  if (*(WastLexer **)((long)register0x00000020 + -0x138) != (WastLexer *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15215b;
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)((long)register0x00000020 + -0x138),
               *(WastLexer **)((long)register0x00000020 + -0x138));
  }
  if (*(void **)((long)register0x00000020 + -0x78) != (void *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0x15216d;
    operator_delete(*(void **)((long)register0x00000020 + -0x78));
  }
  return uVar11;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size());
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  Errors errors;
  std::unique_ptr<Module> module;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWatModule(lexer.get(), &module, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateModule(module.get(), &errors, options);
  }

  if (Succeeded(result)) {
    MemoryStream stream(s_log_stream.get());
    s_write_binary_options.features = s_features;
    result = WriteBinaryModule(&stream, module.get(), s_write_binary_options);

    if (Succeeded(result)) {
      if (s_outfile.empty()) {
        s_outfile = DefaultOuputName(s_infile);
      }
      WriteBufferToFile(s_outfile.c_str(), stream.output_buffer());
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}